

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O0

mz_bool mz_zip_writer_update_zip64_extension_block
                  (mz_zip_array *pNew_ext,mz_zip_archive *pZip,mz_uint8 *pExt,uint32_t ext_len,
                  mz_uint64 *pComp_size,mz_uint64 *pUncomp_size,mz_uint64 *pLocal_header_ofs,
                  mz_uint32 *pDisk_start)

{
  mz_uint32 mVar1;
  undefined8 uVar2;
  mz_uint64 mVar3;
  size_t sVar4;
  bool bVar5;
  mz_uint8 **ppmVar6;
  mz_bool mVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong min_new_capacity;
  mz_uint32 field_total_size;
  mz_uint32 field_data_size;
  mz_uint32 field_id;
  mz_uint8 *pExtra_data;
  undefined1 *puStack_280;
  mz_uint32 extra_size_remaining;
  mz_uint8 *pDst;
  mz_uint8 new_ext_block [64];
  mz_uint64 *pUncomp_size_local;
  mz_uint64 *pComp_size_local;
  uint32_t ext_len_local;
  mz_uint8 *pExt_local;
  mz_zip_archive *pZip_local;
  mz_zip_array *pNew_ext_local;
  size_t orig_size_1;
  size_t orig_size;
  
  new_ext_block._56_8_ = pUncomp_size;
  if ((pNew_ext->m_capacity < (ulong)(ext_len + 0x40)) &&
     (mVar7 = mz_zip_array_ensure_capacity(pZip,pNew_ext,(ulong)(ext_len + 0x40),0), mVar7 == 0)) {
    bVar5 = false;
  }
  else {
    bVar5 = true;
  }
  if (bVar5) {
    pNew_ext->m_size = 0;
    if ((((new_ext_block._56_8_ != 0) || (pComp_size != (mz_uint64 *)0x0)) ||
        (pLocal_header_ofs != (mz_uint64 *)0x0)) || (pDisk_start != (mz_uint32 *)0x0)) {
      pDst._0_1_ = 1;
      pDst._1_1_ = 0;
      ppmVar6 = &pDst;
      if (new_ext_block._56_8_ != 0) {
        uVar2 = *(undefined8 *)new_ext_block._56_8_;
        pDst._4_1_ = (undefined1)uVar2;
        pDst._5_1_ = (undefined1)((ulong)uVar2 >> 8);
        pDst._6_1_ = (undefined1)((ulong)uVar2 >> 0x10);
        pDst._7_1_ = (undefined1)((ulong)uVar2 >> 0x18);
        new_ext_block[0] = (mz_uint8)((ulong)uVar2 >> 0x20);
        new_ext_block[1] = (mz_uint8)((ulong)uVar2 >> 0x28);
        new_ext_block[2] = (mz_uint8)((ulong)uVar2 >> 0x30);
        new_ext_block[3] = (mz_uint8)((ulong)uVar2 >> 0x38);
        ppmVar6 = (mz_uint8 **)new_ext_block;
      }
      puStack_280 = (undefined1 *)((long)ppmVar6 + 4);
      if (pComp_size != (mz_uint64 *)0x0) {
        mVar3 = *pComp_size;
        *puStack_280 = (char)mVar3;
        puStack_280[1] = (char)(mVar3 >> 8);
        puStack_280[2] = (char)(mVar3 >> 0x10);
        puStack_280[3] = (char)(mVar3 >> 0x18);
        puStack_280[4] = (char)(mVar3 >> 0x20);
        puStack_280[5] = (char)(mVar3 >> 0x28);
        puStack_280[6] = (char)(mVar3 >> 0x30);
        puStack_280[7] = (char)(mVar3 >> 0x38);
        puStack_280 = puStack_280 + 8;
      }
      if (pLocal_header_ofs != (mz_uint64 *)0x0) {
        mVar3 = *pLocal_header_ofs;
        *puStack_280 = (char)mVar3;
        puStack_280[1] = (char)(mVar3 >> 8);
        puStack_280[2] = (char)(mVar3 >> 0x10);
        puStack_280[3] = (char)(mVar3 >> 0x18);
        puStack_280[4] = (char)(mVar3 >> 0x20);
        puStack_280[5] = (char)(mVar3 >> 0x28);
        puStack_280[6] = (char)(mVar3 >> 0x30);
        puStack_280[7] = (char)(mVar3 >> 0x38);
        puStack_280 = puStack_280 + 8;
      }
      if (pDisk_start != (mz_uint32 *)0x0) {
        mVar1 = *pDisk_start;
        *puStack_280 = (char)mVar1;
        puStack_280[1] = (char)(mVar1 >> 8);
        puStack_280[2] = (char)(mVar1 >> 0x10);
        puStack_280[3] = (char)(mVar1 >> 0x18);
        puStack_280 = puStack_280 + 4;
      }
      pDst._2_2_ = ((short)puStack_280 - (short)&pDst) + -4;
      lVar9 = (long)puStack_280 - (long)&pDst;
      sVar4 = pNew_ext->m_size;
      uVar10 = sVar4 + lVar9;
      if ((pNew_ext->m_capacity < uVar10) &&
         (mVar7 = mz_zip_array_ensure_capacity(pZip,pNew_ext,uVar10,1), mVar7 == 0)) {
        bVar5 = false;
      }
      else {
        pNew_ext->m_size = uVar10;
        bVar5 = true;
      }
      if (bVar5) {
        if (lVar9 != 0) {
          memcpy((void *)((long)pNew_ext->m_p + sVar4 * pNew_ext->m_element_size),&pDst,
                 lVar9 * (ulong)pNew_ext->m_element_size);
        }
        bVar5 = true;
      }
      else {
        bVar5 = false;
      }
      if (!bVar5) {
        if (pZip != (mz_zip_archive *)0x0) {
          pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
        }
        return 0;
      }
    }
    if ((pExt != (mz_uint8 *)0x0) &&
       (_field_data_size = (short *)pExt, pExtra_data._4_4_ = ext_len, ext_len != 0)) {
      do {
        if (pExtra_data._4_4_ < 4) {
          if (pZip != (mz_zip_archive *)0x0) {
            pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
          }
          return 0;
        }
        uVar8 = (ushort)_field_data_size[1] + 4;
        if (pExtra_data._4_4_ < uVar8) {
          if (pZip != (mz_zip_archive *)0x0) {
            pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
          }
          return 0;
        }
        if (*_field_data_size != 1) {
          uVar10 = (ulong)uVar8;
          sVar4 = pNew_ext->m_size;
          min_new_capacity = sVar4 + uVar10;
          if ((pNew_ext->m_capacity < min_new_capacity) &&
             (mVar7 = mz_zip_array_ensure_capacity(pZip,pNew_ext,min_new_capacity,1), mVar7 == 0)) {
            bVar5 = false;
          }
          else {
            pNew_ext->m_size = min_new_capacity;
            bVar5 = true;
          }
          if (bVar5) {
            if (uVar10 != 0) {
              memcpy((void *)((long)pNew_ext->m_p + sVar4 * pNew_ext->m_element_size),
                     _field_data_size,uVar10 * pNew_ext->m_element_size);
            }
            bVar5 = true;
          }
          else {
            bVar5 = false;
          }
          if (!bVar5) {
            if (pZip != (mz_zip_archive *)0x0) {
              pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
            }
            return 0;
          }
        }
        _field_data_size = (short *)((long)_field_data_size + (ulong)uVar8);
        pExtra_data._4_4_ = pExtra_data._4_4_ - uVar8;
      } while (pExtra_data._4_4_ != 0);
    }
    pNew_ext_local._0_4_ = 1;
  }
  else {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    }
    pNew_ext_local._0_4_ = 0;
  }
  return (mz_bool)pNew_ext_local;
}

Assistant:

static mz_bool mz_zip_writer_update_zip64_extension_block(mz_zip_array *pNew_ext, mz_zip_archive *pZip, const mz_uint8 *pExt, uint32_t ext_len, mz_uint64 *pComp_size, mz_uint64 *pUncomp_size, mz_uint64 *pLocal_header_ofs, mz_uint32 *pDisk_start)
{
    /* + 64 should be enough for any new zip64 data */
    if (!mz_zip_array_reserve(pZip, pNew_ext, ext_len + 64, MZ_FALSE))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    mz_zip_array_resize(pZip, pNew_ext, 0, MZ_FALSE);

    if ((pUncomp_size) || (pComp_size) || (pLocal_header_ofs) || (pDisk_start))
    {
        mz_uint8 new_ext_block[64];
        mz_uint8 *pDst = new_ext_block;
        mz_write_le16(pDst, MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID);
        mz_write_le16(pDst + sizeof(mz_uint16), 0);
        pDst += sizeof(mz_uint16) * 2;

        if (pUncomp_size)
        {
            mz_write_le64(pDst, *pUncomp_size);
            pDst += sizeof(mz_uint64);
        }

        if (pComp_size)
        {
            mz_write_le64(pDst, *pComp_size);
            pDst += sizeof(mz_uint64);
        }

        if (pLocal_header_ofs)
        {
            mz_write_le64(pDst, *pLocal_header_ofs);
            pDst += sizeof(mz_uint64);
        }

        if (pDisk_start)
        {
            mz_write_le32(pDst, *pDisk_start);
            pDst += sizeof(mz_uint32);
        }

        mz_write_le16(new_ext_block + sizeof(mz_uint16), (mz_uint16)((pDst - new_ext_block) - sizeof(mz_uint16) * 2));

        if (!mz_zip_array_push_back(pZip, pNew_ext, new_ext_block, pDst - new_ext_block))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if ((pExt) && (ext_len))
    {
        mz_uint32 extra_size_remaining = ext_len;
        const mz_uint8 *pExtra_data = pExt;

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            if (field_id != MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                if (!mz_zip_array_push_back(pZip, pNew_ext, pExtra_data, field_total_size))
                    return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);
    }

    return MZ_TRUE;
}